

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::Minefield_Response_NACK_PDU
          (Minefield_Response_NACK_PDU *this,KDataStream *stream)

{
  KDataStream *stream_local;
  Minefield_Response_NACK_PDU *this_local;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Response_NACK_PDU_0032b950;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReqID);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_vSeqNums);
  (*(this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

Minefield_Response_NACK_PDU::Minefield_Response_NACK_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}